

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O0

string * __thiscall
helics::RandomDropFilterOperation::getString_abi_cxx11_
          (RandomDropFilterOperation *this,string_view property)

{
  string_view sVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  bool bVar2;
  char *in_RDX;
  char *in_RSI;
  string *in_RDI;
  string *psVar3;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  
  psVar3 = in_RDI;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff90,in_RSI);
  __x._M_str = in_stack_ffffffffffffffb0;
  __x._M_len = in_stack_ffffffffffffffa8;
  __y._M_str = in_stack_ffffffffffffffa0;
  __y._M_len = in_stack_ffffffffffffff98;
  bVar2 = std::operator==(__x,__y);
  if (!bVar2) {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff90,in_RSI);
    __x_00._M_str = in_RDX;
    __x_00._M_len = in_stack_ffffffffffffffa8;
    __y_00._M_str = in_stack_ffffffffffffffa0;
    __y_00._M_len = in_stack_ffffffffffffff98;
    bVar2 = std::operator==(__x_00,__y_00);
    if (!bVar2) {
      sVar1._M_str = in_RSI;
      sVar1._M_len = (size_t)psVar3;
      FilterOperations::getString_abi_cxx11_((FilterOperations *)in_RDI,sVar1);
      return psVar3;
    }
  }
  std::__atomic_float<double>::load((__atomic_float<double> *)(in_RSI + 8),seq_cst);
  std::__cxx11::to_string((double)in_RSI);
  return psVar3;
}

Assistant:

std::string RandomDropFilterOperation::getString(std::string_view property)
{
    if ((property == "dropprob") || (property == "prob")) {
        return std::to_string(dropProb.load());
    }
    return FilterOperations::getString(property);
}